

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_truncate(Pager *pPager,Pgno nPage)

{
  int amt;
  char *__s;
  long size;
  char *pTmp;
  int szPage;
  i64 newSize;
  i64 currentSize;
  int rc;
  Pgno nPage_local;
  Pager *pPager_local;
  
  currentSize._0_4_ = 0;
  if ((pPager->fd->pMethods != (sqlite3_io_methods *)0x0) &&
     ((3 < pPager->eState || (pPager->eState == '\0')))) {
    amt = pPager->pageSize;
    currentSize._4_4_ = nPage;
    _rc = pPager;
    currentSize._0_4_ = sqlite3OsFileSize(pPager->fd,&newSize);
    size = (long)amt * (ulong)currentSize._4_4_;
    if (((int)currentSize == 0) && (newSize != size)) {
      if (size < newSize) {
        currentSize._0_4_ = sqlite3OsTruncate(_rc->fd,size);
      }
      else if (newSize + amt <= size) {
        __s = _rc->pTmpSpace;
        memset(__s,0,(long)amt);
        currentSize._0_4_ = sqlite3OsWrite(_rc->fd,__s,amt,size - amt);
      }
      if ((int)currentSize == 0) {
        _rc->dbFileSize = currentSize._4_4_;
      }
    }
  }
  return (int)currentSize;
}

Assistant:

static int pager_truncate(Pager *pPager, Pgno nPage){
  int rc = SQLITE_OK;
  assert( pPager->eState!=PAGER_ERROR );
  assert( pPager->eState!=PAGER_READER );
  
  if( isOpen(pPager->fd) 
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN) 
  ){
    i64 currentSize, newSize;
    int szPage = pPager->pageSize;
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    /* TODO: Is it safe to use Pager.dbFileSize here? */
    rc = sqlite3OsFileSize(pPager->fd, &currentSize);
    newSize = szPage*(i64)nPage;
    if( rc==SQLITE_OK && currentSize!=newSize ){
      if( currentSize>newSize ){
        rc = sqlite3OsTruncate(pPager->fd, newSize);
      }else if( (currentSize+szPage)<=newSize ){
        char *pTmp = pPager->pTmpSpace;
        memset(pTmp, 0, szPage);
        testcase( (newSize-szPage) == currentSize );
        testcase( (newSize-szPage) >  currentSize );
        rc = sqlite3OsWrite(pPager->fd, pTmp, szPage, newSize-szPage);
      }
      if( rc==SQLITE_OK ){
        pPager->dbFileSize = nPage;
      }
    }
  }
  return rc;
}